

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

ConstantType __thiscall
winmd::reader::table_base::get_value<winmd::reader::ConstantType>
          (table_base *this,uint32_t row,uint32_t column)

{
  uint8_t uVar1;
  ConstantType CVar2;
  uint uVar3;
  ulong uVar4;
  string local_30;
  
  if (row <= this->m_row_count) {
    uVar1 = (this->m_columns)._M_elems[column].size;
    uVar3 = this->m_row_size * row;
    uVar4 = (ulong)(this->m_columns)._M_elems[column].offset;
    if (((uVar1 == '\x04') || (uVar1 == '\x02')) || (uVar1 != '\x01')) {
      CVar2 = *(ConstantType *)(this->m_data + uVar4 + uVar3);
    }
    else {
      CVar2 = (ConstantType)this->m_data[uVar4 + uVar3];
    }
    return CVar2;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Invalid row index","");
  impl::throw_invalid(&local_30);
}

Assistant:

T get_value(uint32_t const row, uint32_t const column) const
        {
            static_assert(std::is_enum_v<T> || std::is_integral_v<T>);
            uint32_t const data_size = m_columns[column].size;
            XLANG_ASSERT(data_size == 1 || data_size == 2 || data_size == 4 || data_size == 8);
            XLANG_ASSERT(data_size <= sizeof(T));

            if (row > size())
            {
                impl::throw_invalid("Invalid row index");
            }

            uint8_t const* ptr = m_data + row * m_row_size + m_columns[column].offset;
            switch (data_size)
            {
            case  1:
            {
                uint8_t temp = *ptr;
                return static_cast<T>(temp);
            }
            case 2:
            {
                uint16_t temp = *reinterpret_cast<uint16_t const*>(ptr);
                return static_cast<T>(temp);
            }
            case 4:
            {
                uint32_t temp = *reinterpret_cast<uint32_t const*>(ptr);
                return static_cast<T>(temp);
            }
            default:
            {
                uint64_t temp = *reinterpret_cast<uint64_t const*>(ptr);
                return static_cast<T>(temp);
            }
            }
        }